

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_trace.cpp
# Opt level: O0

void __thiscall FTraceInfo::EnterLinePortal(FTraceInfo *this,FPathTraverse *pt,intercept_t *in)

{
  line_t_conflict *src;
  FLinePortal *pFVar1;
  sector_t_conflict *psVar2;
  double dVar3;
  TVector3<double> local_b0;
  TVector3<double> local_98;
  TVector2<double> local_80;
  TVector3<double> local_70;
  undefined1 local_58 [8];
  DVector3 exit;
  double enterdist;
  double frac;
  FLinePortal *port;
  line_t_conflict *li;
  intercept_t *in_local;
  FPathTraverse *pt_local;
  FTraceInfo *this_local;
  
  src = (in->d).line;
  pFVar1 = line_t::getPortal((line_t *)src);
  dVar3 = in->frac + 1.52587890625e-05;
  exit.Z = this->MaxDist * dVar3;
  ::operator*(&local_70,this->MaxDist * in->frac,&this->Vec);
  TVector3<double>::operator+((TVector3<double> *)local_58,&this->Start,&local_70);
  P_TranslatePortalXY(src,(double *)this,&(this->Start).Y);
  P_TranslatePortalZ(src,&(this->Start).Z);
  P_TranslatePortalVXVY(src,&(this->Vec).X,&(this->Vec).Y);
  P_TranslatePortalZ(src,&this->limitz);
  ::operator*(&local_b0,exit.Z,&this->Vec);
  TVector3<double>::operator+(&local_98,&this->Start,&local_b0);
  TVector2<double>::TVector2(&local_80,&local_98);
  psVar2 = (sector_t_conflict *)P_PointInSector(&local_80);
  this->CurSector = psVar2;
  this->EnterDist = exit.Z;
  this->inshootthrough = 1;
  this->startfrac = dVar3;
  this->Results->unlinked = (this->Results->unlinked & 1U) != 0 || pFVar1->mType != '\x03';
  FPathTraverse::PortalRelocate(pt,in,this->ptflags,(DVector3 *)0x0);
  if (((this->TraceFlags & 0x10) != 0) &&
     (this->TraceCallback != (_func_ETraceStatus_FTraceResults_ptr_void_ptr *)0x0)) {
    exit.Z = this->MaxDist * in->frac;
    this->Results->HitType = TRACE_CrossingPortal;
    TVector3<double>::operator=(&this->Results->HitPos,(TVector3<double> *)local_58);
    P_TranslatePortalXY(src,(double *)local_58,&exit.X);
    P_TranslatePortalZ(src,&exit.Y);
    TVector3<double>::operator=(&this->Results->SrcFromTarget,(TVector3<double> *)local_58);
    TVector3<double>::operator=(&this->Results->HitVector,&this->Vec);
    (*this->TraceCallback)(this->Results,this->TraceCallbackData);
  }
  return;
}

Assistant:

void FTraceInfo::EnterLinePortal(FPathTraverse &pt, intercept_t *in)
{
	line_t *li = in->d.line;
	FLinePortal *port = li->getPortal();

	double frac = in->frac + EQUAL_EPSILON;
	double enterdist = MaxDist * frac;
	DVector3 exit = Start + MaxDist * in->frac * Vec;

	P_TranslatePortalXY(li, Start.X, Start.Y);
	P_TranslatePortalZ(li, Start.Z);
	P_TranslatePortalVXVY(li, Vec.X, Vec.Y);
	P_TranslatePortalZ(li, limitz);

	CurSector = P_PointInSector(Start + enterdist * Vec);
	EnterDist = enterdist;
	inshootthrough = true;
	startfrac = frac;
	Results->unlinked |= (port->mType != PORTT_LINKED);
	pt.PortalRelocate(in, ptflags);

	if ((TraceFlags & TRACE_ReportPortals) && TraceCallback != NULL)
	{
		enterdist = MaxDist * in->frac;
		Results->HitType = TRACE_CrossingPortal;
		Results->HitPos = exit;
		P_TranslatePortalXY(li, exit.X, exit.Y);
		P_TranslatePortalZ(li, exit.Z);
		Results->SrcFromTarget = exit;
		Results->HitVector = Vec;
		TraceCallback(*Results, TraceCallbackData);
	}
}